

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O2

void __thiscall LRGrammaticalAnalyzer::LRGrammaticalAnalyzer(LRGrammaticalAnalyzer *this)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  pointer pbVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  istream *piVar6;
  long *plVar7;
  mapped_type_conflict1 *pmVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  long lVar11;
  int i;
  int iVar12;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar13;
  pointer pbVar14;
  allocator local_7f7;
  allocator local_7f6;
  allocator local_7f5;
  int stid;
  int sz;
  int toid;
  allocator local_7e7;
  allocator local_7e6;
  allocator local_7e5;
  allocator local_7e4;
  allocator local_7e3;
  allocator local_7e2;
  allocator local_7e1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_7e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_7d8;
  vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  *local_7d0;
  string item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rightpart;
  string leftpart;
  string fr;
  string to;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  x;
  ifstream readgoto;
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  ifstream readproduction;
  ifstream readaction;
  
  p_Var1 = &(this->VT)._M_t._M_impl.super__Rb_tree_header;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->VN)._M_t._M_impl.super__Rb_tree_header;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->FIRST)._M_t._M_impl.super__Rb_tree_header;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->FOLLOW)._M_t._M_impl.super__Rb_tree_header;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->P)._M_t._M_impl.super__Rb_tree_header;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->START)._M_dataplus._M_p = (pointer)&(this->START).field_2;
  (this->START)._M_string_length = 0;
  (this->START).field_2._M_local_buf[0] = '\0';
  p_Var5 = &this->ACTION[0]._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar11 = 0xae0;
  do {
    ((_Rb_tree_node_base *)&p_Var5->_M_color)->_M_color = _S_red;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    p_Var5->_M_left = p_Var5;
    p_Var5->_M_right = p_Var5;
    *(undefined8 *)(p_Var5 + 1) = 0;
    p_Var5 = (_Base_ptr)&p_Var5[1]._M_left;
    lVar11 = lVar11 + -0x30;
  } while (lVar11 != 0);
  local_7e0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this->ACTION;
  lVar11 = 0xbf8;
  do {
    puVar2 = &(this->VT)._M_t._M_impl.field_0x0 + lVar11;
    *(undefined4 *)(&(this->VT)._M_t._M_impl.field_0x0 + lVar11) = 0;
    *(undefined8 *)
     ((long)&(this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar11) = 0;
    *(undefined1 **)
     ((long)&(this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar11) = puVar2;
    *(undefined1 **)
     ((long)&(this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + lVar11) = puVar2;
    *(undefined8 *)
     ((long)&(this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_right + lVar11) = 0;
    lVar11 = lVar11 + 0x30;
  } while (lVar11 != 0x16d8);
  local_7d0 = (vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
               *)&this->VectorP;
  (this->VectorP).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->VectorP).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->VectorP).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)&this->START);
  std::__cxx11::string::string((string *)&readgoto,"{",(allocator *)&readaction);
  std::__cxx11::string::string(local_6c0,"}",(allocator *)&readproduction);
  std::__cxx11::string::string(local_6a0,"if",(allocator *)&x);
  std::__cxx11::string::string(local_680,"(",(allocator *)&fr);
  std::__cxx11::string::string(local_660,")",(allocator *)&to);
  std::__cxx11::string::string(local_640,"then",(allocator *)&leftpart);
  std::__cxx11::string::string(local_620,"else",(allocator *)&item);
  std::__cxx11::string::string(local_600,"while",(allocator *)&rightpart);
  std::__cxx11::string::string(local_5e0,">",(allocator *)&stid);
  std::__cxx11::string::string(local_5c0,"<",(allocator *)&toid);
  std::__cxx11::string::string(local_5a0,"<=",(allocator *)&sz);
  std::__cxx11::string::string(local_580,">=",&local_7f5);
  std::__cxx11::string::string(local_560,"==",&local_7f6);
  std::__cxx11::string::string(local_540,"=",&local_7f7);
  std::__cxx11::string::string((string *)&local_520,";",&local_7e1);
  std::__cxx11::string::string(local_500,"ID",&local_7e2);
  std::__cxx11::string::string(local_4e0,"NUM",&local_7e3);
  std::__cxx11::string::string(local_4c0,"+",&local_7e4);
  std::__cxx11::string::string(local_4a0,"-",&local_7e5);
  std::__cxx11::string::string(local_480,"*",&local_7e6);
  std::__cxx11::string::string(local_460,"/",&local_7e7);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_assign_unique<std::__cxx11::string_const*>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&readgoto,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&readproduction);
  local_7d8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this->GOTO;
  lVar11 = 0x280;
  do {
    std::__cxx11::string::~string((string *)(&readgoto + lVar11));
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x20);
  std::__cxx11::string::string((string *)&readgoto,"program",(allocator *)&readaction);
  std::__cxx11::string::string(local_6c0,"compoundstmt",(allocator *)&readproduction);
  std::__cxx11::string::string(local_6a0,"stmt",(allocator *)&x);
  std::__cxx11::string::string(local_680,"ifstmt",(allocator *)&fr);
  std::__cxx11::string::string(local_660,"whilestmt",(allocator *)&to);
  std::__cxx11::string::string(local_640,"assgstmt",(allocator *)&leftpart);
  std::__cxx11::string::string(local_620,"stmts",(allocator *)&item);
  std::__cxx11::string::string(local_600,"boolexpr",(allocator *)&rightpart);
  std::__cxx11::string::string(local_5e0,"arithexpr",(allocator *)&stid);
  std::__cxx11::string::string(local_5c0,"multexpr",(allocator *)&toid);
  std::__cxx11::string::string(local_5a0,"arithexprprime",(allocator *)&sz);
  std::__cxx11::string::string(local_580,"simpleexpr",&local_7f5);
  std::__cxx11::string::string(local_560,"multexprprime",&local_7f6);
  std::__cxx11::string::string(local_540,"boolop",&local_7f7);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_assign_unique<std::__cxx11::string_const*>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->VN,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&readgoto,
             &local_520);
  lVar11 = 0x1a0;
  do {
    std::__cxx11::string::~string((string *)(&readgoto + lVar11));
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x20);
  std::ifstream::ifstream(&readgoto,"GOTO.txt",_S_in);
  fr._M_dataplus._M_p = (pointer)&fr.field_2;
  fr._M_string_length = 0;
  fr.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar6 = (istream *)std::istream::operator>>((istream *)&readgoto,&stid);
    piVar6 = std::operator>>(piVar6,(string *)&fr);
    plVar7 = (long *)std::istream::operator>>(piVar6,&toid);
    iVar12 = toid;
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) break;
    if (toid != 0) {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)((long)&local_7d8->first + (long)stid * 0x30),&fr);
      *pmVar8 = iVar12;
    }
  }
  std::ifstream::close();
  std::ifstream::ifstream(&readaction,"ACTION.txt",_S_in);
  to._M_dataplus._M_p = (pointer)&to.field_2;
  to._M_string_length = 0;
  to.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar6 = (istream *)std::istream::operator>>((istream *)&readaction,&stid);
    piVar6 = std::operator>>(piVar6,(string *)&fr);
    piVar6 = std::operator>>(piVar6,(string *)&to);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    bVar4 = std::operator==(&to,"0");
    if (!bVar4) {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)local_7e0 + (long)stid * 0x30),&fr);
      std::__cxx11::string::_M_assign((string *)pmVar9);
    }
  }
  std::ifstream::close();
  std::ifstream::ifstream(&readproduction,"PRODUCTION.txt",_S_in);
  leftpart._M_dataplus._M_p = (pointer)&leftpart.field_2;
  leftpart._M_string_length = 0;
  leftpart.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar6 = std::operator>>((istream *)&readproduction,(string *)&leftpart);
    plVar7 = (long *)std::istream::operator>>(piVar6,&sz);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) break;
    rightpart.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    item._M_dataplus._M_p = (pointer)&item.field_2;
    item._M_string_length = 0;
    rightpart.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rightpart.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    item.field_2._M_local_buf[0] = '\0';
    for (iVar12 = 0; iVar12 < sz; iVar12 = iVar12 + 1) {
      std::operator>>((istream *)&readproduction,(string *)&item);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&rightpart,&item);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
              (&x,&leftpart,&rightpart);
    std::
    vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
    ::
    emplace_back<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_7d0,&x);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair(&x);
    std::__cxx11::string::~string((string *)&item);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&rightpart);
  }
  std::ifstream::close();
  local_7e0 = (this->VectorP).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  ppVar13 = (this->VectorP).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (ppVar13 != local_7e0) {
    local_7d8 = ppVar13;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair(&x,ppVar13);
    poVar10 = std::operator<<((ostream *)&std::cout,(string *)&x);
    std::operator<<(poVar10,' ');
    pbVar3 = x.second.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar14 = x.second.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar3;
        pbVar14 = pbVar14 + 1) {
      std::__cxx11::string::string((string *)&item,(string *)pbVar14);
      poVar10 = std::operator<<((ostream *)&std::cout,(string *)&item);
      std::operator<<(poVar10,' ');
      std::__cxx11::string::~string((string *)&item);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair(&x);
    ppVar13 = local_7d8 + 1;
  }
  std::__cxx11::string::~string((string *)&leftpart);
  std::ifstream::~ifstream(&readproduction);
  std::__cxx11::string::~string((string *)&to);
  std::ifstream::~ifstream(&readaction);
  std::__cxx11::string::~string((string *)&fr);
  std::ifstream::~ifstream(&readgoto);
  return;
}

Assistant:

LRGrammaticalAnalyzer::LRGrammaticalAnalyzer() {
//    GOTO[0]["S"] = 1;
//    GOTO[0]["B"] = 2;
//    GOTO[2]["B"] = 5;
//    GOTO[3]["B"] = 6;
//
//    //r0->r3
//    //r1->r2
//    //r2->r0
//    //r3->r1
//
//    ACTION[0]["a"] = "s3";
//    ACTION[0]["b"] = "s4";
//
//    ACTION[1]["$"] = "acc";
//
//    ACTION[2]["a"] = "s3";
//    ACTION[2]["b"] = "s4";
//
//    ACTION[3]["a"] = "s3";
//    ACTION[3]["b"] = "s4";
//
//    ACTION[4]["a"] = "r1";
//    ACTION[4]["b"] = "r1";
//    ACTION[4]["$"] = "r1";
//
//    ACTION[5]["a"] = "r2";
//    ACTION[5]["b"] = "r2";
//    ACTION[5]["$"] = "r2";
//
//    ACTION[6]["a"] = "r0";
//    ACTION[6]["b"] = "r0";
//    ACTION[6]["c"] = "r0";
//
//    START = "S'";
//    VT = {"a", "b", "$"};
//    VN = {"S", "B", "S'"};
//    P.insert({"S'", {"S"}});
//    P.insert({"S", {"B", "B"}});
//    P.insert({"B", {"a", "B"}});
//    P.insert({"B", {"b"}});
//
//    for (auto x:P)
//        VectorP.push_back(x);

//    for(auto x:VectorP){
//        std::cout<<x.first<<' ';
//        for(auto y:x.second){
//            std::cout<<y<<' ';
//        }
//        std::cout<<std::endl;
//    }

    START = "program'";
    VT = {"{", "}", "if", "(", ")", "then", "else", "while", ">", "<", "<=", ">=", "==", "=", ";", "ID", "NUM", "+",
          "-", "*", "/"};
    VN = {"program", "compoundstmt", "stmt", "ifstmt", "whilestmt", "assgstmt",
          "stmts", "boolexpr", "arithexpr", "multexpr", "arithexprprime", "simpleexpr",
          "multexprprime", "boolop"};

    std::ifstream readgoto("GOTO.txt");
    int stid, toid;
    std::string fr;
    while (readgoto >> stid >> fr >> toid) {
        if (toid == 0)
            continue;
        GOTO[stid][fr] = toid;
    }
    readgoto.close();

    std::ifstream readaction("ACTION.txt");
    std::string to;
    while (readaction >> stid >> fr >> to) {
        if (to == "0")
            continue;
        ACTION[stid][fr] = to;
    }
    readaction.close();

    std::ifstream readproduction("PRODUCTION.txt");
    std::string leftpart;
    int sz;
    while (readproduction >> leftpart >> sz) {
        std::vector<std::string> rightpart;
        std::string item;
        for (int i = 0; i < sz; i++) {
            readproduction >> item;
            rightpart.push_back(item);
        }
        VectorP.push_back(make_pair(leftpart, rightpart));
    }
    readproduction.close();
    for (auto x:VectorP) {
        std::cout << x.first << ' ';
        for (auto y:x.second) {
            std::cout << y << ' ';
        }
        std::cout << std::endl;
    }
}